

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *con,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  double lb;
  bool bVar1;
  int v;
  ConstraintAcceptanceLevel CVar2;
  Context ct;
  byte bVar3;
  AlgConRange rng;
  LinTerms lt;
  LinearFunctionalConstraint exprTerm;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> lc;
  LinTerms local_218;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_1a0;
  NLConstraint local_100;
  
  lt.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&lt.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  lt.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  lt.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  lt.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  lt.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&lt.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  lt.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (&exprTerm,
             (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_LinTerms,&lt);
  lb = (con->super_AlgConRhs<0>).rhs_;
  if (exprTerm.affine_expr_.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size == 1 &&
      exprTerm.affine_expr_.constant_term_ == 0.0) {
    if ((*exprTerm.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr != 1.0) ||
       (NAN(*exprTerm.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr))) {
LAB_00262862:
      ct.value_ = CTX_NEG;
      if (-1e+20 < lb) {
        ct.value_ = (lb < 1e+20) + 2 + (uint)(lb < 1e+20);
      }
      Context::Add(&exprTerm.super_FunctionalConstraint.ctx,ct);
      v = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)(this + -0x208),&exprTerm);
    }
    else {
      v = *exprTerm.affine_expr_.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    }
    if (v < 0) {
      bVar3 = 0;
      goto LAB_002629ea;
    }
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this + -0x208);
    if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= v) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    }
    CVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                      ((BasicConstraintKeeper *)(this + 0x6e38));
    if (CVar2 != Recommended) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsResultVar
                ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    }
    bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    if (!bVar1) goto LAB_00262a04;
    LinTerms::add_term(&lt,1.0,v);
    LinTerms::sort_terms(&lt,true);
    if (lt.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size < 2) {
      bVar1 = true;
      FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(this_00,v,lb,lb);
      goto LAB_00262a87;
    }
    CVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevel((BasicConstraintKeeper *)(this + 0xc70))
    ;
    bVar3 = 1;
    v = -1;
    if (CVar2 != Recommended) goto LAB_002629ea;
    LinTerms::LinTerms(&local_218,&lt);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              (&lc,&local_218,(AlgConRhs<0>)(con->super_AlgConRhs<0>).rhs_,false);
    LinTerms::~LinTerms(&local_218);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint(&local_1a0,&lc);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                *)this_00,&local_1a0);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_1a0);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&lc);
  }
  else {
    if (exprTerm.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) goto LAB_00262862;
    bVar3 = 0;
    v = -1;
LAB_002629ea:
    CVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevel((BasicConstraintKeeper *)(this + 0xc70))
    ;
    if ((bool)(~bVar3 & CVar2 == Recommended)) {
      bVar1 = false;
      goto LAB_00262a87;
    }
LAB_00262a04:
    rng.ub_ = lb;
    rng.lb_ = lb;
    NLConstraint::NLConstraint((NLConstraint *)&lc,&lt,v,rng,false);
    NLConstraint::NLConstraint(&local_100,(NLConstraint *)&lc);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddConstraint<mp::NLConstraint>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)(this + -0x208),&local_100);
    NLConstraint::~NLConstraint(&local_100);
    NLConstraint::~NLConstraint((NLConstraint *)&lc);
  }
  bVar1 = true;
LAB_00262a87:
  LinearFunctionalConstraint::~LinearFunctionalConstraint(&exprTerm);
  LinTerms::~LinTerms(&lt);
  return bVar1;
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }